

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscSim.c
# Opt level: O3

void Ssc_GiaPrintPiPatterns(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  iVar1 = p->vCis->nSize;
  if (0 < (long)iVar1) {
    lVar3 = 0;
    do {
      iVar2 = p->vCis->pArray[lVar3];
      if ((iVar2 < 0) || (p->nObjs <= iVar2)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return;
      }
      iVar2 = (p->vSimsPi->nSize / (iVar1 - p->nRegs)) * iVar2;
      if ((iVar2 < 0) || (p->vSims->nSize <= iVar2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                      ,0x19d,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      lVar3 = lVar3 + 1;
    } while (iVar1 != lVar3);
  }
  return;
}

Assistant:

void Ssc_GiaPrintPiPatterns( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    word * pSimAig;
    int i;//, nWords = Gia_ObjSimWords( p );
    Gia_ManForEachCi( p, pObj, i )
    {
        pSimAig = Gia_ObjSimObj( p, pObj );
//        Extra_PrintBinary( stdout, pSimAig, 64 * nWords );
    }
}